

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void * canvas_undo_set_arrange(_glist *x,t_gobj *obj,int newindex)

{
  int iVar1;
  int *piVar2;
  t_undo_arrange *buf;
  int newindex_local;
  t_gobj *obj_local;
  _glist *x_local;
  
  if ((*(ushort *)&x->field_0xe8 >> 5 & 1) == 0) {
    canvas_editmode(x,1.0);
  }
  iVar1 = glist_isselected(x,obj);
  if (iVar1 == 0) {
    glist_select(x,obj);
  }
  piVar2 = (int *)getbytes(8);
  if (newindex == 0) {
    piVar2[1] = 0;
  }
  else {
    iVar1 = glist_getindex(x,(t_gobj *)0x0);
    piVar2[1] = iVar1 + -1;
  }
  iVar1 = glist_getindex(x,obj);
  *piVar2 = iVar1;
  return piVar2;
}

Assistant:

void *canvas_undo_set_arrange(t_canvas *x, t_gobj *obj, int newindex)
{
        /* newindex tells us is the new index at the beginning (0) or the end (1) */

    t_undo_arrange *buf;
        /* enable editor (in case it is disabled) and select the object
           we are working on */
    if (!x->gl_edit)
        canvas_editmode(x, 1);

        /* select the object*/
    if (!glist_isselected(x, obj))
        glist_select(x, obj);

    buf = (t_undo_arrange *)getbytes(sizeof(*buf));

        /* set the u_newindex appropriately */
    if (newindex == 0) buf->u_newindex = 0;
    else buf->u_newindex = glist_getindex(x, 0) - 1;

        /* store index of the currently selected object */
    buf->u_previndex = glist_getindex(x, obj);

    return (buf);
}